

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadCurves(XMLLoader *this,Ref<embree::XML> *xml,RTCGeometryType type)

{
  string *psVar1;
  void *pvVar2;
  avector<Vec3ff> *paVar3;
  XML *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  HairSetNode *this_01;
  size_type in_RCX;
  XML *pXVar9;
  undefined4 in_register_00000014;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *sig;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *vertices;
  avector<Vec3ff> *positions;
  EVP_PKEY_CTX *ctx;
  uchar *in_R8;
  size_t in_R9;
  ulong uVar10;
  string tessellation_rate;
  Ref<embree::XML> animation_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> curveid;
  Ref<embree::SceneGraph::MaterialNode> material;
  string local_e0;
  undefined8 *local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [40];
  undefined1 local_70 [32];
  Ref<embree::SceneGraph::MaterialNode> local_50;
  XMLLoader *local_48;
  _Alloc_hider local_40;
  _Base_ptr local_38;
  
  local_c0 = (undefined8 *)CONCAT44(in_register_00000014,type);
  psVar1 = (string *)*local_c0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_98._32_8_ = in_RCX;
  local_48 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"material","");
  XML::child((XML *)local_b8,psVar1);
  loadMaterial((XMLLoader *)&stack0xffffffffffffffc0,xml);
  if ((XML *)local_b8._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  this_01 = (HairSetNode *)operator_new(0x118);
  local_50.ptr = (MaterialNode *)local_40._M_p;
  local_98._24_8_ = this_01;
  if ((_Base_ptr)local_40._M_p != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_40._M_p + 0x10))(local_40._M_p);
  }
  local_38 = (_Base_ptr)local_40._M_p;
  SceneGraph::HairSetNode::HairSetNode
            (this_01,(RTCGeometryType)local_98._32_8_,&local_50,(BBox1f)0x3f80000000000000,0);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  if ((_Base_ptr)local_50.ptr != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_50.ptr + 0x18))();
  }
  psVar1 = (string *)*local_c0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"animated_positions","");
  XML::childOpt((XML *)local_98,psVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((XML *)local_98._0_8_ == (XML *)0x0) {
    psVar1 = (string *)*local_c0;
    local_b8._0_8_ = (XML *)(local_b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"positions","");
    uVar5 = local_98._24_8_;
    XML::childOpt((XML *)local_70,psVar1);
    loadVec3ffArray((avector<Vec3ff> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_70);
    std::
    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0x70))->_M_use_count,
               (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
               &local_e0);
    alignedFree((void *)local_e0.field_2._8_8_);
    local_e0._M_string_length = 0;
    local_e0.field_2._M_allocated_capacity = 0;
    local_e0.field_2._8_8_ = (void *)0x0;
    if ((long *)local_70._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_70._0_8_ + 0x18))();
    }
    if ((XML *)local_b8._0_8_ != (XML *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    pXVar9 = (XML *)*local_c0;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"positions2","");
    bVar6 = XML::hasChild(pXVar9,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if (bVar6) {
      psVar1 = (string *)*local_c0;
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"positions2","");
      XML::childOpt((XML *)local_70,psVar1);
      loadVec3ffArray((avector<Vec3ff> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_70);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0x70))->_M_use_count,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      local_e0._M_string_length = 0;
      local_e0.field_2._M_allocated_capacity = 0;
      local_e0.field_2._8_8_ = (void *)0x0;
      if ((long *)local_70._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_70._0_8_ + 0x18))();
      }
      if ((XML *)local_b8._0_8_ != (XML *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_);
      }
    }
  }
  else if ((((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            (local_98._0_8_ + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish !=
           (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            (local_98._0_8_ + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_start) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_98._24_8_ + 0x70);
    uVar10 = 0;
    do {
      XML::child((XML *)local_b8,local_98._0_8_);
      loadVec3ffArray((avector<Vec3ff> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_b8);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)&p_Var4->_M_use_count,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      local_e0._M_string_length = 0;
      local_e0.field_2._M_allocated_capacity = 0;
      local_e0.field_2._8_8_ = (void *)0x0;
      if ((XML *)local_b8._0_8_ != (XML *)0x0) {
        (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                       *)(local_98._0_8_ + 0x80))->
                                    super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                       *)(local_98._0_8_ + 0x80))->
                                    super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((XML *)local_98._0_8_ != (XML *)0x0) {
    (*((RefCount *)local_98._0_8_)->_vptr_RefCount[3])();
  }
  uVar5 = local_98._24_8_;
  psVar1 = (string *)*local_c0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"animated_normals","");
  XML::childOpt((XML *)local_b8,psVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((XML *)local_b8._0_8_ == (XML *)0x0) {
    psVar1 = (string *)*local_c0;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"normals","");
    XML::childOpt((XML *)local_98,psVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((XML *)local_98._0_8_ != (XML *)0x0) {
      loadVec3faArray((avector<Vec3fa> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_98);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)(uVar5 + 0x90),
                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      if ((XML *)local_98._0_8_ != (XML *)0x0) {
        (*((RefCount *)local_98._0_8_)->_vptr_RefCount[3])();
      }
    }
    if ((XML *)local_b8._0_8_ != (XML *)0x0) goto LAB_00182d66;
  }
  else {
    if (*(pointer *)(local_b8._0_8_ + 0x88) !=
        (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
         (local_b8._0_8_ + 0x80))->
        super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      uVar10 = 0;
      do {
        XML::child((XML *)local_98,local_b8._0_8_);
        loadVec3faArray((avector<Vec3fa> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_98);
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)(uVar5 + 0x90),
                   (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   &local_e0);
        alignedFree((void *)local_e0.field_2._8_8_);
        local_e0._M_string_length = 0;
        local_e0.field_2._M_allocated_capacity = 0;
        local_e0.field_2._8_8_ = (void *)0x0;
        if ((XML *)local_98._0_8_ != (XML *)0x0) {
          (*((RefCount *)local_98._0_8_)->_vptr_RefCount[3])();
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)((long)*(pointer *)(local_b8._0_8_ + 0x88) -
                                (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                         *)(local_b8._0_8_ + 0x80))->
                                      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_00182d66:
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))(local_b8._0_8_);
  }
  uVar5 = local_98._24_8_;
  if (2 < local_98._32_4_ - 0x28) goto LAB_001830d9;
  psVar1 = (string *)*local_c0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"animated_tangents","");
  XML::childOpt((XML *)local_b8,psVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((XML *)local_b8._0_8_ == (XML *)0x0) {
    psVar1 = (string *)*local_c0;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"tangents","");
    XML::childOpt((XML *)local_98,psVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((XML *)local_98._0_8_ != (XML *)0x0) {
      loadVec3ffArray((avector<Vec3ff> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_98);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0xa0))->_M_use_count,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_e0);
      alignedFree((void *)local_e0.field_2._8_8_);
      if ((XML *)local_98._0_8_ != (XML *)0x0) {
        (*((RefCount *)local_98._0_8_)->_vptr_RefCount[3])();
      }
    }
    if ((XML *)local_b8._0_8_ != (XML *)0x0) goto LAB_00182f1e;
  }
  else {
    if (*(pointer *)(local_b8._0_8_ + 0x88) !=
        (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
         (local_b8._0_8_ + 0x80))->
        super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      uVar10 = 0;
      do {
        XML::child((XML *)local_98,local_b8._0_8_);
        loadVec3ffArray((avector<Vec3ff> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_98);
        std::
        vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                    *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0xa0))->
                       _M_use_count,
                   (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                   &local_e0);
        alignedFree((void *)local_e0.field_2._8_8_);
        local_e0._M_string_length = 0;
        local_e0.field_2._M_allocated_capacity = 0;
        local_e0.field_2._8_8_ = (void *)0x0;
        if ((XML *)local_98._0_8_ != (XML *)0x0) {
          (*((RefCount *)local_98._0_8_)->_vptr_RefCount[3])();
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)((long)*(pointer *)(local_b8._0_8_ + 0x88) -
                                (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                         *)(local_b8._0_8_ + 0x80))->
                                      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_00182f1e:
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))(local_b8._0_8_);
  }
  uVar5 = local_98._24_8_;
  if (local_98._32_4_ == 0x2a) {
    psVar1 = (string *)*local_c0;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"animated_normal_derivatives","");
    XML::childOpt((XML *)local_b8,psVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((XML *)local_b8._0_8_ == (XML *)0x0) {
      psVar1 = (string *)*local_c0;
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"normal_derivatives","");
      XML::childOpt((XML *)local_98,psVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((XML *)local_98._0_8_ != (XML *)0x0) {
        loadVec3faArray((avector<Vec3fa> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_98);
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)(uVar5 + 0xc0),
                   (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   &local_e0);
        alignedFree((void *)local_e0.field_2._8_8_);
        if ((XML *)local_98._0_8_ != (XML *)0x0) {
          (*((RefCount *)local_98._0_8_)->_vptr_RefCount[3])();
        }
      }
      if ((XML *)local_b8._0_8_ == (XML *)0x0) goto LAB_001830d9;
    }
    else if (*(pointer *)(local_b8._0_8_ + 0x88) !=
             (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
              (local_b8._0_8_ + 0x80))->
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             )._M_impl.super__Vector_impl_data._M_start) {
      uVar10 = 0;
      do {
        XML::child((XML *)local_98,local_b8._0_8_);
        loadVec3faArray((avector<Vec3fa> *)&local_e0,(XMLLoader *)xml,(Ref<embree::XML> *)local_98);
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)(uVar5 + 0xc0),
                   (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   &local_e0);
        alignedFree((void *)local_e0.field_2._8_8_);
        local_e0._M_string_length = 0;
        local_e0.field_2._M_allocated_capacity = 0;
        local_e0.field_2._8_8_ = (void *)0x0;
        if ((XML *)local_98._0_8_ != (XML *)0x0) {
          (*((RefCount *)local_98._0_8_)->_vptr_RefCount[3])();
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)((long)*(pointer *)(local_b8._0_8_ + 0x88) -
                                (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                         *)(local_b8._0_8_ + 0x80))->
                                      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))(local_b8._0_8_);
  }
LAB_001830d9:
  uVar5 = local_98._24_8_;
  psVar1 = (string *)*local_c0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"indices","");
  XML::childOpt((XML *)local_b8,psVar1);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,(XMLLoader *)xml,
                (Ref<embree::XML> *)local_b8);
  if ((XML *)local_b8._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  psVar1 = (string *)*local_c0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"curveid","");
  XML::childOpt((XML *)local_b8,psVar1);
  loadUIntArray((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,(XMLLoader *)xml,
                (Ref<embree::XML> *)local_b8);
  if ((XML *)local_b8._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  local_e0._M_dataplus._M_p = local_e0._M_dataplus._M_p & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
             (long)(local_98._8_8_ - local_98._0_8_) >> 2,(value_type_conflict2 *)&local_e0);
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::resize((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0xd0))->_M_use_count,
           (long)(local_98._8_8_ - local_98._0_8_) >> 2);
  if (local_98._8_8_ != local_98._0_8_) {
    uVar10 = 0;
    do {
      *(ulong *)(*(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0xd0))->
                           _M_use_count + uVar10 * 8) =
           CONCAT44(*(undefined4 *)(local_70._0_8_ + uVar10 * 4),
                    *(undefined4 *)
                     ((long)&((RefCount *)local_98._0_8_)->_vptr_RefCount + uVar10 * 4));
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(local_98._8_8_ - local_98._0_8_) >> 2));
  }
  psVar1 = (string *)*local_c0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  pXVar9 = (XML *)local_98._0_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"flags","");
  XML::childOpt((XML *)(local_70 + 0x18),psVar1);
  loadUCharArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,(XMLLoader *)xml,
                 (Ref<embree::XML> *)(local_70 + 0x18));
  pvVar2 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
            &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0xf0))->
             _vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data._M_start;
  (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0xf0))->_vptr__Sp_counted_base)->
  _M_impl).super__Vector_impl_data._M_start = local_b8._0_8_;
  *(undefined8 *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0xf0))->_M_use_count =
       local_b8._8_8_;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0x100))->_vptr__Sp_counted_base =
       (_func_int **)local_b8._16_8_;
  local_b8._0_8_ = (XML *)0x0;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = (element_type *)0x0;
  if ((pvVar2 != (void *)0x0) && (operator_delete(pvVar2), (XML *)local_b8._0_8_ != (XML *)0x0)) {
    operator_delete((void *)local_b8._0_8_);
  }
  if ((_Base_ptr)local_70._24_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_70._24_8_ + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_98._32_4_ - 0x20 < 3) {
    positions = (((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0x70))->_M_use_count
                 )->
                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    paVar3 = (avector<Vec3ff> *)
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0x80))->
             _vptr__Sp_counted_base;
    if (positions != paVar3) {
      do {
        fix_bspline_end_points
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,positions);
        positions = positions + 1;
      } while (positions != paVar3);
    }
  }
  this_00 = (XML *)*local_c0;
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"tessellation_rate","");
  XML::parm(&local_e0,this_00,(string *)local_b8);
  if ((XML *)local_b8._0_8_ != (XML *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_);
  }
  ctx = (EVP_PKEY_CTX *)0x25041e;
  iVar7 = std::__cxx11::string::compare((char *)&local_e0);
  sig = extraout_RDX;
  if (iVar7 != 0) {
    uVar8 = atoi(local_e0._M_dataplus._M_p);
    *(uint *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar5 + 0x110))->
              _vptr__Sp_counted_base = uVar8;
    sig = extraout_RDX_00;
  }
  SceneGraph::HairSetNode::verify((HairSetNode *)uVar5,ctx,sig,(size_t)pXVar9,in_R8,in_R9);
  (local_48->path).filename._M_dataplus._M_p = (pointer)uVar5;
  (**(code **)((long)(((Node *)uVar5)->super_RefCount)._vptr_RefCount + 0x10))(uVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((long *)local_70._0_8_ != (long *)0x0) {
    operator_delete((void *)local_70._0_8_);
  }
  if ((XML *)local_98._0_8_ != (XML *)0x0) {
    operator_delete((void *)local_98._0_8_);
  }
  (**(code **)((long)(((Node *)uVar5)->super_RefCount)._vptr_RefCount + 0x18))(uVar5);
  if (local_38 != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_38 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)local_48;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadCurves(const Ref<XML>& xml, RTCGeometryType type)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
      }
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) {
        mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions2")));
      }
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++) {
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
      }
    } else if (Ref<XML> normals = xml->childOpt("normals")) {
      mesh->normals.push_back(loadVec3faArray(normals));
    }

    if (type == RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE ||
        type == RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE ||
        type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE)
    {
      if (Ref<XML> animation = xml->childOpt("animated_tangents")) {
        for (size_t i=0; i<animation->size(); i++) {
          mesh->tangents.push_back(loadVec3ffArray(animation->child(i)));
        }
      } else if (Ref<XML> tangents = xml->childOpt("tangents")) {
        mesh->tangents.push_back(loadVec3ffArray(tangents));
      }
    }

    if (type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE)
    {
      if (Ref<XML> animation = xml->childOpt("animated_normal_derivatives")) {
        for (size_t i=0; i<animation->size(); i++) {
          mesh->dnormals.push_back(loadVec3faArray(animation->child(i)));
        }
      } else if (Ref<XML> dnormals = xml->childOpt("normal_derivatives")) {
        mesh->dnormals.push_back(loadVec3faArray(dnormals));
      }
    }

    std::vector<unsigned> indices = loadUIntArray(xml->childOpt("indices"));
    std::vector<unsigned> curveid = loadUIntArray(xml->childOpt("curveid"));
    curveid.resize(indices.size(),0);
    mesh->hairs.resize(indices.size());
    for (size_t i=0; i<indices.size(); i++) {
      mesh->hairs[i] = SceneGraph::HairSetNode::Hair(indices[i],
                                                     curveid[i]);
    }

    mesh->flags = loadUCharArray(xml->childOpt("flags"));
    
    if (type == RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE ||
        type == RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE ||
        type == RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE)
    {
      for (auto& vertices : mesh->positions)
        fix_bspline_end_points(indices,vertices);
    }

    std::string tessellation_rate = xml->parm("tessellation_rate");
    if (tessellation_rate != "")
      mesh->tessellation_rate = atoi(tessellation_rate.c_str());

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }